

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::CodePointToUtf8_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,UInt32 code_point)

{
  byte bVar1;
  uint uVar2;
  char str [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  uVar2 = (uint)this;
  if (0x1fffff < uVar2) {
    String::FormatHexUInt32_abi_cxx11_(&local_38,(String *)this,code_point);
    std::operator+(&local_58,"(Invalid Unicode 0x",&local_38);
    std::operator+(__return_storage_ptr__,&local_58,")");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    return __return_storage_ptr__;
  }
  if (uVar2 < 0x80) {
    local_58._M_dataplus._M_p._1_1_ = 0;
  }
  else {
    if (uVar2 < 0x800) {
      local_58._M_dataplus._M_p._2_1_ = 0;
      local_58._M_dataplus._M_p._0_1_ = (byte)((ulong)this >> 6) | 0xc0;
      local_58._M_dataplus._M_p._1_1_ = (byte)this & 0x3f | 0x80;
      goto LAB_0012058c;
    }
    bVar1 = (byte)this & 0x3f | 0x80;
    local_58._M_dataplus._M_p._0_1_ = (byte)((ulong)this >> 0xc);
    local_58._M_dataplus._M_p._2_1_ = (byte)((ulong)this >> 6) & 0x3f | 0x80;
    if (uVar2 < 0x10000) {
      local_58._M_dataplus._M_p._3_1_ = 0;
      local_58._M_dataplus._M_p._0_1_ = (byte)local_58._M_dataplus._M_p | 0xe0;
      local_58._M_dataplus._M_p._1_1_ = local_58._M_dataplus._M_p._2_1_;
      local_58._M_dataplus._M_p._2_1_ = bVar1;
      goto LAB_0012058c;
    }
    local_58._M_dataplus._M_p._4_1_ = 0;
    local_58._M_dataplus._M_p._1_1_ = (byte)local_58._M_dataplus._M_p & 0x3f | 0x80;
    this = (internal *)(ulong)(byte)((byte)(uVar2 >> 0x12) | 0xf0);
    local_58._M_dataplus._M_p._3_1_ = bVar1;
  }
  local_58._M_dataplus._M_p._0_1_ = (byte)this;
LAB_0012058c:
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(char *)&local_58,(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string CodePointToUtf8(UInt32 code_point) {
  if (code_point > kMaxCodePoint4) {
    return "(Invalid Unicode 0x" + String::FormatHexUInt32(code_point) + ")";
  }

  char str[5];  // Big enough for the largest valid code point.
  if (code_point <= kMaxCodePoint1) {
    str[1] = '\0';
    str[0] = static_cast<char>(code_point);                          // 0xxxxxxx
  } else if (code_point <= kMaxCodePoint2) {
    str[2] = '\0';
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xC0 | code_point);                   // 110xxxxx
  } else if (code_point <= kMaxCodePoint3) {
    str[3] = '\0';
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xE0 | code_point);                   // 1110xxxx
  } else {  // code_point <= kMaxCodePoint4
    str[4] = '\0';
    str[3] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xF0 | code_point);                   // 11110xxx
  }
  return str;
}